

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

void __thiscall
optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
          (Common_Expr_Del *this,bool offset_inst)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_MirOptimizePass)._vptr_MirOptimizePass =
       (_func_int **)&PTR_pass_name_abi_cxx11__001eb488;
  this->offset_inst = offset_inst;
  p_Var1 = &(this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name,"Common expression delete","");
  return;
}

Assistant:

Common_Expr_Del(bool offset_inst = false) : offset_inst(offset_inst) {}